

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_optimizeTrainFromBuffer_cover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_cover_params_t *parameters)

{
  double splitPoint;
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  POOL_ctx *ctx_00;
  size_t sVar7;
  long *__ptr;
  clock_t cVar8;
  uint uVar9;
  uint d;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  char *__ptr_00;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  size_t sStack_1a0;
  int local_188;
  COVER_ctx_t ctx;
  COVER_best_t best;
  
  uVar20 = -(ulong)(0.0 < parameters->splitPoint);
  uVar13 = parameters->k;
  uVar15 = parameters->d;
  bVar18 = uVar15 == 0;
  uVar11 = 6;
  if (!bVar18) {
    uVar11 = (ulong)uVar15;
  }
  uVar14 = 8;
  if (!bVar18) {
    uVar14 = uVar15;
  }
  uVar17 = 0x28;
  if (parameters->steps != 0) {
    uVar17 = (ulong)parameters->steps;
  }
  bVar19 = uVar13 != 0;
  uVar15 = 0x32;
  if (bVar19) {
    uVar15 = uVar13;
  }
  uVar16 = 2000;
  if (bVar19) {
    uVar16 = uVar13;
  }
  uVar13 = 0x79e;
  if (bVar19) {
    uVar13 = 0;
  }
  iVar6 = (int)(uVar13 / uVar17);
  uVar12 = iVar6 + (uint)(iVar6 == 0);
  uVar9 = uVar13 / uVar12 + 1 << bVar18;
  splitPoint = (double)(~uVar20 & 0x3ff0000000000000 | (ulong)parameters->splitPoint & uVar20);
  uVar13 = (parameters->zParams).notificationLevel;
  if ((1.0 < splitPoint) || (uVar15 < uVar14 || uVar16 < uVar15)) {
    sVar7 = 0xffffffffffffffd6;
    if ((int)uVar13 < 1) {
      return 0xffffffffffffffd6;
    }
    __ptr_00 = "Incorrect parameters\n";
    sStack_1a0 = 0x15;
  }
  else {
    if (nbSamples != 0) {
      if (0xff < dictBufferCapacity) {
        if (parameters->nbThreads < 2) {
          ctx_00 = (POOL_ctx *)0x0;
        }
        else {
          ctx_00 = POOL_create((ulong)parameters->nbThreads,1);
          if (ctx_00 == (POOL_ctx *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        COVER_best_init(&best);
        g_displayLevel = uVar13 - 1;
        bVar18 = g_displayLevel != 0;
        if (uVar13 == 0) {
          g_displayLevel = 0;
        }
        if (bVar18 && 0 < (int)uVar13) {
          fprintf(_stderr,"Trying %u different sets of parameters\n",(ulong)uVar9);
          fflush(_stderr);
        }
        local_188 = 1;
        bVar18 = true;
        do {
          d = (uint)uVar11;
          if (uVar14 < d) {
            if (1 < (int)uVar13) {
              fprintf(_stderr,"\r%79s\r","");
              fflush(_stderr);
            }
            sVar7 = best.compressedSize;
            if (best.compressedSize < 0xffffffffffffff89) {
              (parameters->zParams).compressionLevel = best.parameters.zParams.compressionLevel;
              (parameters->zParams).notificationLevel = best.parameters.zParams.notificationLevel;
              *(undefined8 *)&(parameters->zParams).dictID = best.parameters._40_8_;
              parameters->splitPoint = best.parameters.splitPoint;
              parameters->shrinkDict = best.parameters.shrinkDict;
              parameters->shrinkDictMaxRegression = best.parameters.shrinkDictMaxRegression;
              parameters->k = best.parameters.k;
              parameters->d = best.parameters.d;
              parameters->steps = best.parameters.steps;
              parameters->nbThreads = best.parameters.nbThreads;
              memcpy(dictBuffer,best.dict,best.dictSize);
              sVar7 = best.dictSize;
            }
            COVER_best_destroy(&best);
LAB_001acff1:
            POOL_free(ctx_00);
            return sVar7;
          }
          if (2 < (int)uVar13) {
            fprintf(_stderr,"d=%u\n",uVar11);
            fflush(_stderr);
          }
          sVar7 = COVER_ctx_init(&ctx,samplesBuffer,samplesSizes,nbSamples,d,splitPoint);
          if (0xffffffffffffff88 < sVar7) {
            if (0 < (int)uVar13) {
              fwrite("Failed to initialize context\n",0x1d,1,_stderr);
              fflush(_stderr);
            }
            COVER_best_destroy(&best);
            goto LAB_001acff1;
          }
          if (bVar18) {
            COVER_warnOnSmallCorpus(dictBufferCapacity,ctx.suffixSize,uVar13);
          }
          for (uVar10 = uVar15; uVar10 <= uVar16; uVar10 = uVar10 + uVar12) {
            __ptr = (long *)malloc(0x48);
            if (2 < (int)uVar13) {
              fprintf(_stderr,"k=%u\n",(ulong)uVar10);
              fflush(_stderr);
            }
            if (__ptr == (long *)0x0) {
              if (0 < (int)uVar13) {
                fwrite("Failed to allocate parameters\n",0x1e,1,_stderr);
                fflush(_stderr);
              }
              COVER_best_destroy(&best);
              COVER_ctx_destroy(&ctx);
              sVar7 = 0xffffffffffffffc0;
              goto LAB_001acff1;
            }
            *__ptr = (long)&ctx;
            __ptr[1] = (long)&best;
            __ptr[2] = dictBufferCapacity;
            lVar1 = *(long *)&parameters->steps;
            dVar2 = parameters->splitPoint;
            lVar3 = *(long *)&parameters->shrinkDict;
            lVar4 = *(long *)&parameters->zParams;
            lVar5 = *(long *)&(parameters->zParams).dictID;
            __ptr[3] = *(long *)parameters;
            __ptr[4] = lVar1;
            __ptr[5] = (long)dVar2;
            __ptr[6] = lVar3;
            __ptr[7] = lVar4;
            __ptr[8] = lVar5;
            *(uint *)(__ptr + 3) = uVar10;
            *(uint *)((long)__ptr + 0x1c) = d;
            __ptr[5] = (long)splitPoint;
            *(int *)(__ptr + 4) = (int)uVar17;
            *(undefined4 *)(__ptr + 6) = 0;
            iVar6 = g_displayLevel;
            *(int *)((long)__ptr + 0x3c) = g_displayLevel;
            if ((dictBufferCapacity < uVar10) || (uVar10 <= d - 1)) {
              if (0 < iVar6) {
                fwrite("Cover parameters incorrect\n",0x1b,1,_stderr);
                fflush(_stderr);
              }
              free(__ptr);
            }
            else {
              COVER_best_start(&best);
              if (ctx_00 == (POOL_ctx *)0x0) {
                COVER_tryParameters(__ptr);
              }
              else {
                POOL_add(ctx_00,COVER_tryParameters,__ptr);
              }
              if ((1 < (int)uVar13) && ((cVar8 = clock(), 150000 < cVar8 - g_time || (3 < uVar13))))
              {
                g_time = clock();
                fprintf(_stderr,"\r%u%%       ",(ulong)(uint)(local_188 * 100) / (ulong)uVar9);
                fflush(_stderr);
              }
              local_188 = local_188 + 1;
            }
          }
          COVER_best_wait(&best);
          COVER_ctx_destroy(&ctx);
          uVar11 = (ulong)(d + 2);
          bVar18 = false;
        } while( true );
      }
      sVar7 = 0xffffffffffffffba;
      if (g_displayLevel < 1) {
        return 0xffffffffffffffba;
      }
      fprintf(_stderr,"dictBufferCapacity must be at least %u\n",0x100);
      goto LAB_001acd1b;
    }
    sVar7 = 0xffffffffffffffb8;
    if (g_displayLevel < 1) {
      return 0xffffffffffffffb8;
    }
    __ptr_00 = "Cover must have at least one input file\n";
    sStack_1a0 = 0x28;
  }
  fwrite(__ptr_00,sStack_1a0,1,_stderr);
LAB_001acd1b:
  fflush(_stderr);
  return sVar7;
}

Assistant:

ZDICTLIB_API size_t ZDICT_optimizeTrainFromBuffer_cover(
    void* dictBuffer, size_t dictBufferCapacity, const void* samplesBuffer,
    const size_t* samplesSizes, unsigned nbSamples,
    ZDICT_cover_params_t* parameters)
{
  /* constants */
  const unsigned nbThreads = parameters->nbThreads;
  const double splitPoint =
      parameters->splitPoint <= 0.0 ? COVER_DEFAULT_SPLITPOINT : parameters->splitPoint;
  const unsigned kMinD = parameters->d == 0 ? 6 : parameters->d;
  const unsigned kMaxD = parameters->d == 0 ? 8 : parameters->d;
  const unsigned kMinK = parameters->k == 0 ? 50 : parameters->k;
  const unsigned kMaxK = parameters->k == 0 ? 2000 : parameters->k;
  const unsigned kSteps = parameters->steps == 0 ? 40 : parameters->steps;
  const unsigned kStepSize = MAX((kMaxK - kMinK) / kSteps, 1);
  const unsigned kIterations =
      (1 + (kMaxD - kMinD) / 2) * (1 + (kMaxK - kMinK) / kStepSize);
  const unsigned shrinkDict = 0;
  /* Local variables */
  const int displayLevel = parameters->zParams.notificationLevel;
  unsigned iteration = 1;
  unsigned d;
  unsigned k;
  COVER_best_t best;
  POOL_ctx *pool = NULL;
  int warned = 0;

  /* Checks */
  if (splitPoint <= 0 || splitPoint > 1) {
    LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect parameters\n");
    return ERROR(parameter_outOfBound);
  }
  if (kMinK < kMaxD || kMaxK < kMinK) {
    LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect parameters\n");
    return ERROR(parameter_outOfBound);
  }
  if (nbSamples == 0) {
    DISPLAYLEVEL(1, "Cover must have at least one input file\n");
    return ERROR(srcSize_wrong);
  }
  if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
    DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                 ZDICT_DICTSIZE_MIN);
    return ERROR(dstSize_tooSmall);
  }
  if (nbThreads > 1) {
    pool = POOL_create(nbThreads, 1);
    if (!pool) {
      return ERROR(memory_allocation);
    }
  }
  /* Initialization */
  COVER_best_init(&best);
  /* Turn down global display level to clean up display at level 2 and below */
  g_displayLevel = displayLevel == 0 ? 0 : displayLevel - 1;
  /* Loop through d first because each new value needs a new context */
  LOCALDISPLAYLEVEL(displayLevel, 2, "Trying %u different sets of parameters\n",
                    kIterations);
  for (d = kMinD; d <= kMaxD; d += 2) {
    /* Initialize the context for this value of d */
    COVER_ctx_t ctx;
    LOCALDISPLAYLEVEL(displayLevel, 3, "d=%u\n", d);
    {
      const size_t initVal = COVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples, d, splitPoint);
      if (ZSTD_isError(initVal)) {
        LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to initialize context\n");
        COVER_best_destroy(&best);
        POOL_free(pool);
        return initVal;
      }
    }
    if (!warned) {
      COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.suffixSize, displayLevel);
      warned = 1;
    }
    /* Loop through k reusing the same context */
    for (k = kMinK; k <= kMaxK; k += kStepSize) {
      /* Prepare the arguments */
      COVER_tryParameters_data_t *data = (COVER_tryParameters_data_t *)malloc(
          sizeof(COVER_tryParameters_data_t));
      LOCALDISPLAYLEVEL(displayLevel, 3, "k=%u\n", k);
      if (!data) {
        LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to allocate parameters\n");
        COVER_best_destroy(&best);
        COVER_ctx_destroy(&ctx);
        POOL_free(pool);
        return ERROR(memory_allocation);
      }
      data->ctx = &ctx;
      data->best = &best;
      data->dictBufferCapacity = dictBufferCapacity;
      data->parameters = *parameters;
      data->parameters.k = k;
      data->parameters.d = d;
      data->parameters.splitPoint = splitPoint;
      data->parameters.steps = kSteps;
      data->parameters.shrinkDict = shrinkDict;
      data->parameters.zParams.notificationLevel = g_displayLevel;
      /* Check the parameters */
      if (!COVER_checkParameters(data->parameters, dictBufferCapacity)) {
        DISPLAYLEVEL(1, "Cover parameters incorrect\n");
        free(data);
        continue;
      }
      /* Call the function and pass ownership of data to it */
      COVER_best_start(&best);
      if (pool) {
        POOL_add(pool, &COVER_tryParameters, data);
      } else {
        COVER_tryParameters(data);
      }
      /* Print status */
      LOCALDISPLAYUPDATE(displayLevel, 2, "\r%u%%       ",
                         (unsigned)((iteration * 100) / kIterations));
      ++iteration;
    }
    COVER_best_wait(&best);
    COVER_ctx_destroy(&ctx);
  }
  LOCALDISPLAYLEVEL(displayLevel, 2, "\r%79s\r", "");
  /* Fill the output buffer and parameters with output of the best parameters */
  {
    const size_t dictSize = best.dictSize;
    if (ZSTD_isError(best.compressedSize)) {
      const size_t compressedSize = best.compressedSize;
      COVER_best_destroy(&best);
      POOL_free(pool);
      return compressedSize;
    }
    *parameters = best.parameters;
    memcpy(dictBuffer, best.dict, dictSize);
    COVER_best_destroy(&best);
    POOL_free(pool);
    return dictSize;
  }
}